

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

void __thiscall ktx::CommandExtract::initOptions(CommandExtract *this,Options *opts)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options;
  allocator<char> local_72;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  string local_30 [32];
  
  Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
  ::init(&this->options,(EVP_PKEY_CTX *)opts);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"input-file",&local_71);
  std::__cxx11::string::string<std::allocator<char>>(local_50,OptionsExtract::kOutput,&local_72);
  options._M_len = 2;
  options._M_array = &local_70;
  cxxopts::Options::parse_positional(opts,options);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_70._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"<input-file> <output>",(allocator<char> *)&local_70);
  std::__cxx11::string::operator=((string *)&opts->m_positional_help,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void CommandExtract::initOptions(cxxopts::Options& opts) {
    options.init(opts);
    opts.parse_positional({"input-file", OptionsExtract::kOutput});
    opts.positional_help("<input-file> <output>");
}